

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q3a_heap_node_relation.cpp
# Opt level: O2

int main(void)

{
  istream *piVar1;
  char *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  bool bVar5;
  int b;
  int a;
  int n;
  int m;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105118) = 0;
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&m);
  std::istream::operator>>(piVar1,&n);
LAB_0010120e:
  bVar5 = n == 0;
  n = n + -1;
  if (bVar5) {
    return 0;
  }
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&a);
  std::istream::operator>>(piVar1,&b);
  pcVar4 = "a and b are the same node";
  if (a != b) {
    if (a == b || a < b) goto code_r0x00101240;
    for (; bVar5 = a == b, !bVar5 && b <= a; a = (a + -1) / 2) {
    }
    pcVar2 = "b is an ancestor of a";
    goto LAB_00101286;
  }
  goto LAB_0010128a;
code_r0x00101240:
  if (a < b) {
    for (; bVar5 = b == a, !bVar5 && a <= b; b = (b + -1) / 2) {
    }
    pcVar2 = "a is an ancestor of b";
LAB_00101286:
    pcVar4 = "a and b are not related";
    if (bVar5) {
      pcVar4 = pcVar2;
    }
LAB_0010128a:
    poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
    std::operator<<(poVar3,"\n");
  }
  goto LAB_0010120e;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);

    int m, n;
    cin >> m >> n;
    while (n--) {
        int a,b;
        cin >> a >> b;
        if (a == b) {
            cout << "a and b are the same node" << endl;
        } else if (a > b) {
            while (a > b) {
                a = (a - 1) / 2;
            }
            if (b == a)
                cout << "b is an ancestor of a" << endl;
            else
                cout << "a and b are not related" << endl;
        } else if (a < b) {
            while (b > a) {
                b = (b - 1) / 2;
            }
            if (b == a)
                cout << "a is an ancestor of b" << endl;
            else
                cout << "a and b are not related" << endl;
        }
    }
}